

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::Release(Element *this)

{
  undefined8 uVar1;
  String local_30;
  Element *local_10;
  Element *this_local;
  
  local_10 = this;
  if (this->instancer == (ElementInstancer *)0x0) {
    GetAddress_abi_cxx11_(&local_30,this,false,true);
    uVar1 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,
                 "Leak detected: element %s not instanced via RmlUi Factory. Unable to release.",
                 uVar1);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    (*this->instancer->_vptr_ElementInstancer[3])();
  }
  return;
}

Assistant:

void Element::Release()
{
	if (instancer)
		instancer->ReleaseElement(this);
	else
		Log::Message(Log::LT_WARNING, "Leak detected: element %s not instanced via RmlUi Factory. Unable to release.", GetAddress().c_str());
}